

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O2

HRESULT AutoSystemInfo::GetJscriptFileVersion
                  (DWORD *majorVersion,DWORD *minorVersion,DWORD *buildDateHash,DWORD *buildTimeHash
                  )

{
  HRESULT HVar1;
  DWORD *pDVar2;
  
  if (Data.minorVersion == 0 && Data.majorVersion == 0) {
    *majorVersion = 0xffffffff;
    *minorVersion = 0xffffffff;
    Data.majorVersion = *majorVersion;
    pDVar2 = minorVersion;
    minorVersion = &Data.minorVersion;
  }
  else {
    if (Data.majorVersion == 0xffffffff) {
      HVar1 = -0x7fffbffb;
      goto LAB_0035cc70;
    }
    *majorVersion = Data.majorVersion;
    pDVar2 = &Data.minorVersion;
  }
  *minorVersion = *pDVar2;
  HVar1 = 0;
LAB_0035cc70:
  if (buildDateHash != (DWORD *)0x0) {
    *buildDateHash = Data.buildDateHash;
  }
  if (buildTimeHash != (DWORD *)0x0) {
    *buildTimeHash = Data.buildTimeHash;
  }
  return HVar1;
}

Assistant:

HRESULT AutoSystemInfo::GetJscriptFileVersion(DWORD* majorVersion, DWORD* minorVersion, DWORD *buildDateHash, DWORD *buildTimeHash)
{
    HRESULT hr = E_FAIL;
    if(AutoSystemInfo::Data.majorVersion == 0 && AutoSystemInfo::Data.minorVersion == 0)
    {
        // uninitialized state  - call the system API to get the version info.
        LPCWSTR jscriptDllName = GetJscriptDllFileName();
        hr = GetVersionInfo(jscriptDllName, majorVersion, minorVersion);

        AutoSystemInfo::Data.majorVersion = *majorVersion;
        AutoSystemInfo::Data.minorVersion = *minorVersion;
    }
    else if(AutoSystemInfo::Data.majorVersion != INVALID_VERSION)
    {
        // if the cached copy is valid, use it and return S_OK.
        *majorVersion = AutoSystemInfo::Data.majorVersion;
        *minorVersion = AutoSystemInfo::Data.minorVersion;
        hr = S_OK;
    }

    if (buildDateHash)
    {
        *buildDateHash = AutoSystemInfo::Data.buildDateHash;
    }

    if (buildTimeHash)
    {
        *buildTimeHash = AutoSystemInfo::Data.buildTimeHash;
    }
    return hr;
}